

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_TVFS.cpp
# Opt level: O2

int __thiscall
TRootHandler_TVFS::IsVfsSubDirectory
          (TRootHandler_TVFS *this,TCascStorage *hs,TVFS_DIRECTORY_HEADER *DirHeader,
          TVFS_DIRECTORY_HEADER *SubHeader,ENCODED_KEY *EKey,DWORD dwFileSize)

{
  bool bVar1;
  int iVar2;
  LPBYTE pbDataPtr;
  DWORD cbVfsData;
  
  cbVfsData = dwFileSize;
  bVar1 = IsVfsFileEKey(this,hs,EKey,(ulong)DirHeader->EKeySize);
  iVar2 = 1000;
  if (bVar1) {
    pbDataPtr = LoadInternalFileToMemory(hs,EKey->Value,2,&cbVfsData);
    if (cbVfsData != 0 && pbDataPtr != (LPBYTE)0x0) {
      iVar2 = CaptureDirectoryHeader(SubHeader,pbDataPtr,pbDataPtr + cbVfsData);
      if (iVar2 == 0) {
        iVar2 = 0;
      }
      else {
        SubHeader->CftOffsSize = 0;
        SubHeader->EstOffsSize = 0;
        SubHeader->pbDirectoryData = (LPBYTE)0x0;
        SubHeader->CftTableSize = 0;
        SubHeader->MaxDepth = 0;
        *(undefined2 *)&SubHeader->field_0x26 = 0;
        SubHeader->EstTableOffset = 0;
        SubHeader->EstTableSize = 0;
        SubHeader->PathTableSize = 0;
        SubHeader->VfsTableOffset = 0;
        SubHeader->VfsTableSize = 0;
        SubHeader->CftTableOffset = 0;
        SubHeader->Signature = 0;
        SubHeader->FormatVersion = '\0';
        SubHeader->HeaderSize = '\0';
        SubHeader->EKeySize = '\0';
        SubHeader->PatchKeySize = '\0';
        SubHeader->Flags = 0;
        SubHeader->PathTableOffset = 0;
        SubHeader->pbDirectoryEnd = (LPBYTE)0x0;
        free(pbDataPtr);
      }
    }
  }
  return iVar2;
}

Assistant:

int IsVfsSubDirectory(TCascStorage * hs,  TVFS_DIRECTORY_HEADER & DirHeader, TVFS_DIRECTORY_HEADER & SubHeader, ENCODED_KEY & EKey, DWORD dwFileSize)
    {
        LPBYTE pbVfsData = NULL;
        DWORD cbVfsData = dwFileSize;
        int nError = ERROR_BAD_FORMAT;

        // Verify whether the EKey is in the list of VFS root files
        if(IsVfsFileEKey(hs, EKey, DirHeader.EKeySize))
        {
            // Load the entire file into memory
            pbVfsData = LoadInternalFileToMemory(hs, EKey.Value, CASC_OPEN_BY_EKEY, &cbVfsData);
            if (pbVfsData && cbVfsData)
            {
                // Capture the file folder. This also serves as test
                nError = CaptureDirectoryHeader(SubHeader, pbVfsData, pbVfsData + cbVfsData);
                if (nError == ERROR_SUCCESS)
                    return nError;

                // Clear the captured header
                memset(&SubHeader, 0, sizeof(TVFS_DIRECTORY_HEADER));
                CASC_FREE(pbVfsData);
            }
        }

        return nError;
    }